

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction.cpp
# Opt level: O3

CreateSignatureHashResponseStruct *
cfd::js::api::TransactionStructApi::GetSighash
          (CreateSignatureHashResponseStruct *__return_storage_ptr__,
          GetSighashRequestStruct *request)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  string *in_R8;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  _Any_data local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [40];
  string local_d0 [16];
  char local_c0 [16];
  string local_b0 [16];
  char local_a0 [16];
  undefined1 local_90 [48];
  undefined1 auStack_60 [40];
  size_t local_38;
  
  (__return_storage_ptr__->sighash)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->sighash).field_2;
  (__return_storage_ptr__->sighash)._M_string_length = 0;
  (__return_storage_ptr__->sighash).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = 0;
  local_128._8_8_ =
       std::
       _Function_handler<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::GetSighashRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:608:20)>
       ::_M_invoke;
  local_128._0_8_ =
       std::
       _Function_handler<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::GetSighashRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:608:20)>
       ::_M_manager;
  local_118._M_unused._M_object = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"GetSighash","");
  ExecuteStructApi<cfd::js::api::GetSighashRequestStruct,cfd::js::api::CreateSignatureHashResponseStruct>
            ((CreateSignatureHashResponseStruct *)local_f8,(api *)request,
             (GetSighashRequestStruct *)local_138,
             (function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::GetSighashRequestStruct_&)>
              *)&local_118,in_R8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_f8);
  (__return_storage_ptr__->error).code = local_f8._32_4_;
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->error).type,local_d0);
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->error).message,local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
  if ((_Base_ptr)local_90._16_8_ != (_Base_ptr)0x0) {
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_90._8_4_;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)local_90._16_8_;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = (_Base_ptr)local_90._24_8_;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = (_Base_ptr)local_90._32_8_;
    *(_Rb_tree_header **)(local_90._16_8_ + 8) = p_Var1;
    (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_90._40_8_;
    local_90._16_8_ = (_Base_ptr)0x0;
    local_90._40_8_ = 0;
    local_90._24_8_ = (_Base_ptr)(local_90 + 8);
    local_90._32_8_ = (_Base_ptr)(local_90 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
  if ((_Base_ptr)auStack_60._16_8_ != (_Base_ptr)0x0) {
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         auStack_60._8_4_;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)auStack_60._16_8_;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)auStack_60._24_8_;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)auStack_60._32_8_;
    *(_Rb_tree_header **)(auStack_60._16_8_ + 8) = p_Var2;
    (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_38;
    auStack_60._16_8_ = (_Base_ptr)0x0;
    local_38 = 0;
    auStack_60._24_8_ = (_Base_ptr)(auStack_60 + 8);
    auStack_60._32_8_ = (_Base_ptr)(auStack_60 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_90);
  if ((char *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_);
  }
  if ((char *)local_d0._0_8_ != local_c0) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_);
  }
  if ((undefined1 *)local_118._M_unused._0_8_ != local_108) {
    operator_delete(local_118._M_unused._M_object);
  }
  if ((code *)local_128._0_8_ != (code *)0x0) {
    (*(code *)local_128._0_8_)(local_138,local_138,3);
  }
  return __return_storage_ptr__;
}

Assistant:

CreateSignatureHashResponseStruct TransactionStructApi::GetSighash(
    const GetSighashRequestStruct& request) {
  auto call_func = [](const GetSighashRequestStruct& request)
      -> CreateSignatureHashResponseStruct {  // NOLINT
    CreateSignatureHashResponseStruct response;
    TransactionContext tx(request.tx);
    AddressFactory factory;
    auto utxo_list =
        TransactionStructApiBase::ConvertUtxoList(request.utxos, &factory);
    tx.CollectInputUtxo(utxo_list);

    AddressType addr_type =
        AddressApiBase::ConvertAddressType(request.txin.hash_type);
    OutPoint outpoint(Txid(request.txin.txid), request.txin.vout);
    bool has_taproot = (addr_type == AddressType::kTaprootAddress);
    SigHashType sighashtype = TransactionStructApiBase::ConvertSigHashType(
        request.txin.sighash_type, request.txin.sighash_anyone_can_pay,
        request.txin.sighash_rangeproof, has_taproot);

    Script redeem_script;
    bool is_pubkey = false;
    if (request.txin.key_data.type == "pubkey") {
      is_pubkey = true;
    } else if (request.txin.key_data.type == "redeem_script") {
      redeem_script = Script(request.txin.key_data.hex);
    }

    if (has_taproot) {
      SchnorrPubkey pubkey;
      if (is_pubkey) pubkey = SchnorrPubkey(request.txin.key_data.hex);
      ByteData annex(request.txin.annex);
      uint32_t pos =
          static_cast<uint32_t>(request.txin.code_separator_position);
      ByteData256 tapleaf_hash;
      if (!is_pubkey) {
        TaprootScriptTree tree(redeem_script);
        tapleaf_hash = tree.GetTapLeafHash();
      }
      auto sighash = tx.CreateSignatureHashByTaproot(
          outpoint, sighashtype, (is_pubkey) ? nullptr : &tapleaf_hash,
          (request.txin.code_separator_position < 0) ? nullptr : &pos,
          (annex.IsEmpty()) ? nullptr : &annex);
      response.sighash = sighash.GetHex();
    } else {
      WitnessVersion version = WitnessVersion::kVersion0;
      if ((addr_type == AddressType::kP2pkhAddress) ||
          (addr_type == AddressType::kP2shAddress)) {
        version = WitnessVersion::kVersionNone;
      }
      auto utxo = tx.GetTxInUtxoData(outpoint);
      ByteData sighash;
      if (is_pubkey) {
        Pubkey pubkey(request.txin.key_data.hex);
        sighash = tx.CreateSignatureHash(
            outpoint, pubkey, sighashtype, utxo.amount, version);
      } else {
        sighash = tx.CreateSignatureHash(
            outpoint, redeem_script, sighashtype, utxo.amount, version);
      }
      response.sighash = sighash.GetHex();
    }
    return response;
  };

  CreateSignatureHashResponseStruct result;
  result = ExecuteStructApi<
      GetSighashRequestStruct, CreateSignatureHashResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}